

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O3

void predict_or_learn<false,true>(interact *in,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  uchar *puVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  features *f_src2;
  ulong uVar9;
  long lVar10;
  features *f_src1;
  
  bVar3 = in->n1;
  f_src1 = (ec->super_example_predict).feature_space + bVar3;
  bVar4 = in->n2;
  f_src2 = (ec->super_example_predict).feature_space + bVar4;
  bVar6 = contains_valid_namespaces(in->all,f_src1,f_src2,in);
  if (!bVar6) {
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    return;
  }
  in->num_features = ec->num_features;
  fVar2 = ec->total_sum_feat_sq;
  in->total_sum_feat_sq = fVar2;
  ec->total_sum_feat_sq =
       (fVar2 - (ec->super_example_predict).feature_space[bVar3].sum_feat_sq) -
       (ec->super_example_predict).feature_space[bVar4].sum_feat_sq;
  ec->num_features =
       ec->num_features -
       (((long)(ec->super_example_predict).feature_space[bVar4].values._end -
         (long)(f_src2->values)._begin >> 2) +
       ((long)(ec->super_example_predict).feature_space[bVar3].values._end -
        (long)(f_src1->values)._begin >> 2));
  features::deep_copy_from(&in->feat_store,f_src1);
  multiply(f_src1,f_src2,in);
  ec->total_sum_feat_sq =
       (ec->super_example_predict).feature_space[bVar3].sum_feat_sq + ec->total_sum_feat_sq;
  ec->num_features =
       ec->num_features +
       ((long)(ec->super_example_predict).feature_space[bVar3].values._end -
        (long)(f_src1->values)._begin >> 2);
  puVar5 = (ec->super_example_predict).indices._begin;
  uVar9 = 0xffffffffffffffff;
  lVar8 = (long)(ec->super_example_predict).indices._end - (long)puVar5;
  if (lVar8 != 0) {
    lVar7 = 0;
    lVar10 = 0;
    do {
      if (puVar5[lVar10] == in->n2) {
        uVar9 = -lVar7 >> 0x20;
        memmove(puVar5 + uVar9,puVar5 + (0x100000000 - lVar7 >> 0x20),lVar8 + ~uVar9);
        ppuVar1 = &(ec->super_example_predict).indices._end;
        *ppuVar1 = *ppuVar1 + -1;
        break;
      }
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + -0x100000000;
    } while (lVar8 != lVar10);
  }
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  v_array<unsigned_char>::incr((v_array<unsigned_char> *)ec);
  puVar5 = (ec->super_example_predict).indices._begin;
  memmove(puVar5 + uVar9 + 1,puVar5 + uVar9,
          (size_t)((ec->super_example_predict).indices._end + (~uVar9 - (long)puVar5)));
  (ec->super_example_predict).indices._begin[uVar9] = in->n2;
  features::deep_copy_from(f_src1,&in->feat_store);
  ec->total_sum_feat_sq = in->total_sum_feat_sq;
  ec->num_features = in->num_features;
  return;
}

Assistant:

void predict_or_learn(interact& in, LEARNER::single_learner& base, example& ec)
{
  features& f1 = ec.feature_space[in.n1];
  features& f2 = ec.feature_space[in.n2];

  if (!contains_valid_namespaces(*in.all, f1, f2, in))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    return;
  }

  in.num_features = ec.num_features;
  in.total_sum_feat_sq = ec.total_sum_feat_sq;
  ec.total_sum_feat_sq -= f1.sum_feat_sq;
  ec.total_sum_feat_sq -= f2.sum_feat_sq;
  ec.num_features -= f1.size();
  ec.num_features -= f2.size();

  in.feat_store.deep_copy_from(f1);

  multiply(f1, f2, in);
  ec.total_sum_feat_sq += f1.sum_feat_sq;
  ec.num_features += f1.size();

  /*for(uint64_t i = 0;i < f1.size();i++)
    cout<<f1[i].weight_index<<":"<<f1[i].x<<" ";
    cout<<endl;*/

  // remove 2nd namespace
  int n2_i = -1;
  for (size_t i = 0; i < ec.indices.size(); i++)
  {
    if (ec.indices[i] == in.n2)
    {
      n2_i = (int)i;
      memmove(&ec.indices[n2_i], &ec.indices[n2_i + 1], sizeof(unsigned char) * (ec.indices.size() - n2_i - 1));
      ec.indices.decr();
      break;
    }
  }

  base.predict(ec);
  if (is_learn)
    base.learn(ec);

  // re-insert namespace into the right position
  ec.indices.incr();
  memmove(&ec.indices[n2_i + 1], &ec.indices[n2_i], sizeof(unsigned char) * (ec.indices.size() - n2_i - 1));
  ec.indices[n2_i] = in.n2;

  f1.deep_copy_from(in.feat_store);
  ec.total_sum_feat_sq = in.total_sum_feat_sq;
  ec.num_features = in.num_features;
}